

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O0

FUNCTION_RETURN
getDiskInfos_dev(vector<DiskInfo,_std::allocator<DiskInfo>_> *disk_infos,
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *disk_by_uuid)

{
  bool bVar1;
  int iVar2;
  FUNCTION_RETURN FVar3;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  reference __src;
  size_type sVar7;
  bool bVar8;
  double __x;
  double dVar9;
  allocator local_ff9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_fd8;
  int local_fb0 [2];
  anon_struct_1296_7_5326303c diskInfo;
  iterator __end5;
  iterator __begin5;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *__range5;
  string local_a80 [7];
  bool found;
  long local_a60;
  size_type pos;
  string local_a50 [8];
  string device_name_s;
  ssize_t len;
  DiskInfo tmpDiskInfo;
  string cur_dir;
  allocator local_4e1;
  undefined1 local_4e0 [8];
  string base_dir;
  DIR *disk_by_uuid_dir;
  char device_name [1024];
  undefined1 local_b0 [4];
  FUNCTION_RETURN result;
  stat sym_stat;
  dirent *dir;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *disk_by_uuid_local;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *disk_infos_local;
  
  sym_stat.__glibc_reserved[2] = 0;
  base_dir.field_2._8_8_ = opendir("/dev/disk/by-uuid");
  if ((DIR *)base_dir.field_2._8_8_ == (DIR *)0x0) {
    piVar4 = __errno_location();
    strerror(*piVar4);
    _log(__x);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_4e0,"/dev/disk/by-uuid/",&local_4e1);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    while( true ) {
      sym_stat.__glibc_reserved[2] = (__syscall_slong_t)readdir((DIR *)base_dir.field_2._8_8_);
      bVar8 = false;
      if ((dirent *)sym_stat.__glibc_reserved[2] != (dirent *)0x0) {
        sVar7 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::size(disk_infos);
        bVar8 = sVar7 < 0x28;
      }
      if (!bVar8) break;
      iVar2 = strcmp((char *)(sym_stat.__glibc_reserved[2] + 0x13),".");
      if (((iVar2 != 0) &&
          (iVar2 = strcmp((char *)(sym_stat.__glibc_reserved[2] + 0x13),".."), iVar2 != 0)) &&
         (iVar2 = strncmp((char *)(sym_stat.__glibc_reserved[2] + 0x13),"usb",3), iVar2 != 0)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (tmpDiskInfo.label + 0xfb),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4e0,(char *)(sym_stat.__glibc_reserved[2] + 0x13));
        pcVar5 = (char *)std::__cxx11::string::c_str();
        iVar2 = stat(pcVar5,(stat *)local_b0);
        if (iVar2 == 0) {
          len._0_4_ = (int)sym_stat.st_dev;
          pcVar5 = (char *)std::__cxx11::string::c_str();
          uVar6 = readlink(pcVar5,(char *)&disk_by_uuid_dir,0x3ff);
          device_name_s.field_2._8_8_ = uVar6;
          if (uVar6 == 0xffffffffffffffff) {
            piVar4 = __errno_location();
            strerror(*piVar4);
            dVar9 = (double)std::__cxx11::string::c_str();
            _log(dVar9);
          }
          else {
            device_name[uVar6 - 8] = '\0';
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_a50,(char *)&disk_by_uuid_dir,uVar6,(allocator *)((long)&pos + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
            local_a60 = std::__cxx11::string::find_last_of((char *)local_a50,0x47a796);
            if (local_a60 != -1) {
              std::__cxx11::string::substr((ulong)local_a80,(ulong)local_a50);
              std::__cxx11::string::operator=(local_a50,local_a80);
              std::__cxx11::string::~string(local_a80);
            }
            pcVar5 = (char *)std::__cxx11::string::c_str();
            license::mstrlcpy((char *)((long)&len + 4),pcVar5,0x400);
            parseUUID((char *)(sym_stat.__glibc_reserved[2] + 0x13),
                      (uchar *)(tmpDiskInfo.device + 0x3f8),8);
            tmpDiskInfo.disk_sn[0] = '\x01';
            tmpDiskInfo.label[0xf7] = '\0';
            tmpDiskInfo.label[0xf8] = '\0';
            bVar8 = false;
            __end5 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::begin(disk_infos);
            diskInfo._1288_8_ = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::end(disk_infos);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end5,(__normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>
                                               *)(diskInfo.label + 0xfb)), bVar1) {
              __src = __gnu_cxx::
                      __normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>
                      ::operator*(&__end5);
              memcpy(local_fb0,__src,0x510);
              if ((int)len == local_fb0[0]) {
                bVar8 = true;
                break;
              }
              __gnu_cxx::
              __normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>::
              operator++(&__end5);
            }
            pcVar5 = (char *)(sym_stat.__glibc_reserved[2] + 0x13);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_ff8,pcVar5,&local_ff9);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_&,_true>
                      (&local_fd8,&local_ff8,(int *)&len);
            std::
            unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
            ::insert<std::pair<std::__cxx11::string,int>>
                      ((unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                        *)disk_by_uuid,&local_fd8);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            ::~pair(&local_fd8);
            std::__cxx11::string::~string((string *)&local_ff8);
            dVar9 = (double)std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
            if (!bVar8) {
              _log(dVar9);
              std::vector<DiskInfo,_std::allocator<DiskInfo>_>::push_back
                        (disk_infos,(value_type *)&len);
            }
            std::__cxx11::string::~string(local_a50);
          }
        }
        else {
          piVar4 = __errno_location();
          strerror(*piVar4);
          dVar9 = (double)std::__cxx11::string::c_str();
          _log(dVar9);
        }
        std::__cxx11::string::~string((string *)(tmpDiskInfo.label + 0xfb));
      }
    }
    closedir((DIR *)base_dir.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_4e0);
  }
  sVar7 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::size(disk_infos);
  device_name._1020_4_ = ZEXT14(sVar7 == 0);
  read_disk_labels(disk_infos);
  FVar3._0_1_ = device_name[0x3fc];
  FVar3._1_1_ = device_name[0x3fd];
  FVar3._2_1_ = device_name[0x3fe];
  FVar3._3_1_ = device_name[0x3ff];
  return FVar3;
}

Assistant:

FUNCTION_RETURN getDiskInfos_dev(std::vector<DiskInfo> &disk_infos,
								 std::unordered_map<std::string, int> &disk_by_uuid) {
	struct dirent *dir = NULL;
	struct stat sym_stat;
	FUNCTION_RETURN result;
	char device_name[MAX_PATH];

	DIR *disk_by_uuid_dir = opendir(ID_FOLDER);
	if (disk_by_uuid_dir == nullptr) {
		LOG_DEBUG("Open " ID_FOLDER " fail: %s", std::strerror(errno));
	} else {
		const std::string base_dir(ID_FOLDER "/");
		while ((dir = readdir(disk_by_uuid_dir)) != nullptr && disk_infos.size() < MAX_UNITS) {
			if (::strcmp(dir->d_name, ".") == 0 || ::strcmp(dir->d_name, "..") == 0 ||
				::strncmp(dir->d_name, "usb", 3) == 0) {
				continue;
			}

			std::string cur_dir = base_dir + dir->d_name;
			if (stat(cur_dir.c_str(), &sym_stat) == 0) {
				DiskInfo tmpDiskInfo;
				tmpDiskInfo.id = sym_stat.st_ino;
				ssize_t len = ::readlink(cur_dir.c_str(), device_name, MAX_PATH - 1);
				if (len != -1) {
					device_name[len] = '\0';
					std::string device_name_s(device_name, len);
					auto pos = device_name_s.find_last_of("/");
					if (pos != std::string::npos) {
						device_name_s = device_name_s.substr(pos + 1);
					}
					mstrlcpy(tmpDiskInfo.device, device_name_s.c_str(), sizeof(tmpDiskInfo.device));
					PARSE_ID_FUNC(dir->d_name, tmpDiskInfo.disk_sn, sizeof(tmpDiskInfo.disk_sn));
					tmpDiskInfo.sn_initialized = true;
					tmpDiskInfo.label_initialized = false;
					tmpDiskInfo.preferred = false;
					bool found = false;
					for (auto diskInfo : disk_infos) {
						if (tmpDiskInfo.id == diskInfo.id) {
							found = true;
							break;
						}
					}
					disk_by_uuid.insert(std::pair<std::string, int>(std::string(dir->d_name), tmpDiskInfo.id));
					if (!found) {
						LOG_DEBUG("Found disk inode %d device %s, sn %s", sym_stat.st_ino, tmpDiskInfo.device,
								  dir->d_name);
						disk_infos.push_back(tmpDiskInfo);
					}
				} else {
					LOG_DEBUG("Error %s during readlink of %s", std::strerror(errno), cur_dir.c_str());
				}
			} else {
				LOG_DEBUG("Error %s during stat of %s", std::strerror(errno), cur_dir.c_str());
			}
		}
		closedir(disk_by_uuid_dir);
	}

	result = disk_infos.size() > 0 ? FUNCTION_RETURN::FUNC_RET_OK : FUNCTION_RETURN::FUNC_RET_NOT_AVAIL;
	read_disk_labels(disk_infos);
	return result;
}